

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void do_actual_learning_ldf<true>(cbify *data,multi_learner *base,multi_ex *ec_seq)

{
  label_t lVar1;
  undefined4 uVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  cbify *pcVar6;
  reference ppeVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  vw_exception *this;
  char *pfile;
  action_score *paVar11;
  undefined8 uVar12;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  label_t *in_RDI;
  example *ec_1;
  size_t i_1;
  stringstream __msg_1;
  cb_class cl;
  stringstream __msg;
  uint32_t chosen_action;
  example *out_ec;
  example *ec;
  size_t i;
  cb_class *in_stack_fffffffffffffb98;
  value_type peVar13;
  v_array<CB::cb_class> *in_stack_fffffffffffffba0;
  action_scores *in_stack_fffffffffffffba8;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_fffffffffffffbb0;
  value_type peVar14;
  string *in_stack_fffffffffffffbb8;
  label_t *plVar15;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *in_stack_fffffffffffffbc0;
  int plineNumber;
  uint32_t *in_stack_fffffffffffffbc8;
  value_type in_stack_fffffffffffffbd8;
  cbify *data_00;
  size_type local_3e0;
  stringstream local_3b0 [16];
  ostream local_3a0;
  float local_224;
  uint32_t local_220;
  float local_21c;
  undefined1 local_211;
  stringstream local_1e0 [16];
  ostream local_1d0;
  uint local_34;
  value_type local_30;
  value_type local_28;
  cbify *local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  label_t *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar4 = std::
          vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
          ::size((vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                  *)(in_RDI + 0x11));
  sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
  if (sVar4 < sVar5) {
    std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
    ::resize((vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
              *)in_stack_fffffffffffffbc0,(size_type)in_stack_fffffffffffffbb8);
  }
  sVar4 = std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::size
                    ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
                     (local_8 + 0x14));
  sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
  if (sVar4 < sVar5) {
    std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::resize
              ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
               in_stack_fffffffffffffbc0,(size_type)in_stack_fffffffffffffbb8);
  }
  sVar4 = std::
          vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ::size((vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                  *)(local_8 + 0x17));
  sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
  if (sVar4 < sVar5) {
    std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::resize(in_stack_fffffffffffffbc0,(size_type)in_stack_fffffffffffffbb8);
  }
  local_20 = (cbify *)0x0;
  while( true ) {
    data_00 = local_20;
    pcVar6 = (cbify *)std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    plineNumber = (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
    if (pcVar6 <= data_00) break;
    ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_18,(size_type)local_20);
    in_stack_fffffffffffffbd8 = *ppeVar7;
    local_28 = in_stack_fffffffffffffbd8;
    pvVar8 = std::
             vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
             ::operator[]((vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                           *)(local_8 + 0x11),(size_type)local_20);
    pvVar8->_begin = (wclass *)(in_stack_fffffffffffffbd8->l).multi;
    pvVar8->_end = (in_stack_fffffffffffffbd8->l).cs.costs._end;
    pvVar8->end_array = (in_stack_fffffffffffffbd8->l).cs.costs.end_array;
    pvVar8->erase_count = (in_stack_fffffffffffffbd8->l).cs.costs.erase_count;
    std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::operator[]
              ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
               (local_8 + 0x14),(size_type)local_20);
    v_array<CB::cb_class>::clear(in_stack_fffffffffffffba0);
    std::
    vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
    ::operator[]((vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                  *)(local_8 + 0x17),(size_type)local_20);
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffba0);
    pvVar9 = std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::operator[]
                       ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
                        (local_8 + 0x14),(size_type)local_20);
    (local_28->l).multi = (label_t)pvVar9->_begin;
    (local_28->l).cs.costs._end = (wclass *)pvVar9->_end;
    (local_28->l).cs.costs.end_array = (wclass *)pvVar9->end_array;
    (local_28->l).cs.costs.erase_count = pvVar9->erase_count;
    pvVar10 = std::
              vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
              ::operator[]((vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                            *)(local_8 + 0x17),(size_type)local_20);
    (local_28->pred).scalars._begin = (float *)pvVar10->_begin;
    (local_28->pred).scalars._end = (float *)pvVar10->_end;
    (local_28->pred).scalars.end_array = (float *)pvVar10->end_array;
    (local_28->pred).scalars.erase_count = pvVar10->erase_count;
    local_20 = (cbify *)((long)&(local_20->cb_label).costs._begin + 1);
  }
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (in_stack_fffffffffffffbb0,
             (vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffba8,
             (size_t)in_stack_fffffffffffffba0);
  ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
  local_30 = *ppeVar7;
  lVar1 = local_8[9];
  local_8[9] = (label_t)((long)lVar1 + 1);
  this = (vw_exception *)((long)local_8[4] + (long)lVar1);
  ACTION_SCORE::begin_scores(in_stack_fffffffffffffba8);
  ACTION_SCORE::end_scores(in_stack_fffffffffffffba8);
  iVar3 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    ((uint64_t)data_00,(score_iterator *)in_stack_fffffffffffffbd8,
                     (score_iterator *)this,in_stack_fffffffffffffbc8);
  if (iVar3 != 0) {
    std::__cxx11::stringstream::stringstream(local_1e0);
    std::operator<<(&local_1d0,"Failed to sample from pdf");
    local_211 = 1;
    pfile = (char *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(this,pfile,plineNumber,in_stack_fffffffffffffbb8);
    local_211 = 0;
    __cxa_throw(pfile,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar11 = v_array<ACTION_SCORE::action_score>::operator[]
                      ((v_array<ACTION_SCORE::action_score> *)&(local_30->pred).scalars,
                       (ulong)local_34);
  local_220 = paVar11->action + 1;
  paVar11 = v_array<ACTION_SCORE::action_score>::operator[]
                      ((v_array<ACTION_SCORE::action_score> *)&(local_30->pred).scalars,
                       (ulong)local_34);
  local_21c = paVar11->score;
  if (local_220 == 0) {
    std::__cxx11::stringstream::stringstream(local_3b0);
    std::operator<<(&local_3a0,"No action with non-zero probability found!");
    uVar12 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (this,(char *)in_stack_fffffffffffffbc8,(int)((ulong)uVar12 >> 0x20),
               in_stack_fffffffffffffbb8);
    __cxa_throw(uVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_224 = loss_csldf(data_00,(vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                                  *)in_stack_fffffffffffffbd8,(uint32_t)((ulong)this >> 0x20));
  v_array<CB::cb_class>::clear(in_stack_fffffffffffffba0);
  v_array<CB::cb_class>::push_back(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (local_18,(ulong)(local_220 - 1));
  peVar14 = *ppeVar7;
  pvVar9 = std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::operator[]
                     ((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
                      (local_8 + 0x14),(ulong)(local_220 - 1));
  pvVar9->_begin = (cb_class *)(peVar14->l).multi;
  pvVar9->_end = (cb_class *)(peVar14->l).cs.costs._end;
  pvVar9->end_array = (cb_class *)(peVar14->l).cs.costs.end_array;
  pvVar9->erase_count = (peVar14->l).cs.costs.erase_count;
  plVar15 = local_8;
  ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (local_18,(ulong)(local_220 - 1));
  peVar13 = *ppeVar7;
  (peVar13->l).multi = *plVar15;
  (peVar13->l).cs.costs._end = (wclass *)plVar15[1];
  (peVar13->l).cs.costs.end_array = (wclass *)plVar15[2];
  (peVar13->l).cs.costs.erase_count = (size_t)plVar15[3];
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
            ((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)peVar14,
             (vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffba8,
             (size_t)in_stack_fffffffffffffba0);
  local_3e0 = 0;
  while( true ) {
    sVar4 = local_3e0;
    sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    if (sVar5 <= sVar4) break;
    ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_3e0);
    peVar14 = *ppeVar7;
    peVar13 = peVar14;
    pvVar10 = std::
              vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
              ::operator[]((vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                            *)(local_8 + 0x17),local_3e0);
    pvVar10->_begin = (action_score *)(peVar13->pred).scalars._begin;
    pvVar10->_end = (action_score *)(peVar13->pred).scalars._end;
    pvVar10->end_array = (action_score *)(peVar13->pred).scalars.end_array;
    pvVar10->erase_count = (peVar13->pred).scalars.erase_count;
    if (local_3e0 == local_220 - 1) {
      *local_8 = (peVar14->l).multi;
      local_8[1] = (label_t)(peVar14->l).cs.costs._end;
      local_8[2] = (label_t)(peVar14->l).cs.costs.end_array;
      uVar2 = *(undefined4 *)((long)&peVar14->l + 0x1c);
      local_8[3].label = *(undefined4 *)((long)&peVar14->l + 0x18);
      local_8[3].weight = (float)uVar2;
    }
    else {
      peVar13 = peVar14;
      pvVar9 = std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::
               operator[]((vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *)
                          (local_8 + 0x14),local_3e0);
      pvVar9->_begin = (cb_class *)(peVar13->l).multi;
      pvVar9->_end = (cb_class *)(peVar13->l).cs.costs._end;
      pvVar9->end_array = (cb_class *)(peVar13->l).cs.costs.end_array;
      pvVar9->erase_count = (peVar13->l).cs.costs.erase_count;
    }
    pvVar8 = std::
             vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
             ::operator[]((vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                           *)(local_8 + 0x11),local_3e0);
    (peVar14->l).multi = (label_t)pvVar8->_begin;
    (peVar14->l).cs.costs._end = pvVar8->_end;
    (peVar14->l).cs.costs.end_array = pvVar8->end_array;
    (peVar14->l).cs.costs.erase_count = pvVar8->erase_count;
    if (local_3e0 == local_220 - 1) {
      (peVar14->pred).multiclass = local_220;
    }
    else {
      (peVar14->pred).scalar = 0.0;
    }
    local_3e0 = local_3e0 + 1;
  }
  return;
}

Assistant:

void do_actual_learning_ldf(cbify& data, multi_learner& base, multi_ex& ec_seq)
{
  // change label and pred data for cb
  if (data.cs_costs.size() < ec_seq.size())
    data.cs_costs.resize(ec_seq.size());
  if (data.cb_costs.size() < ec_seq.size())
    data.cb_costs.resize(ec_seq.size());
  if (data.cb_as.size() < ec_seq.size())
    data.cb_as.resize(ec_seq.size());
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    data.cs_costs[i] = ec.l.cs.costs;
    data.cb_costs[i].clear();
    data.cb_as[i].clear();
    ec.l.cb.costs = data.cb_costs[i];
    ec.pred.a_s = data.cb_as[i];
  }

  base.predict(ec_seq);

  auto& out_ec = *ec_seq[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if(!cl.action)
    THROW("No action with non-zero probability found!");

  cl.cost = loss_csldf(data, data.cs_costs, cl.action);

  // add cb label to chosen action
  data.cb_label.costs.clear();
  data.cb_label.costs.push_back(cl);
  data.cb_costs[cl.action-1] = ec_seq[cl.action-1]->l.cb.costs;
  ec_seq[cl.action - 1]->l.cb = data.cb_label;

  base.learn(ec_seq);

  // set cs prediction and reset cs costs
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    data.cb_as[i]=ec.pred.a_s;//store action_score vector for later reuse.
    if (i == cl.action -1 )
      data.cb_label = ec.l.cb;
    else
      data.cb_costs[i] = ec.l.cb.costs;
    ec.l.cs.costs = data.cs_costs[i];
    if (i == cl.action - 1)
      ec.pred.multiclass = cl.action;
    else
      ec.pred.multiclass = 0;
  }
}